

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-emscripten-finalize.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 *puVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  string *psVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  byte bVar8;
  PassOptions local_14f0;
  undefined1 local_1438 [8];
  ToolOptions options;
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_10f0 [9];
  undefined1 local_ec8 [8];
  Output output;
  allocator<char> local_bb8 [8];
  PassRunner passRunner;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  local_b40 [120];
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ac8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_aa0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a78;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a50;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a28;
  _Any_data local_a00;
  code *local_9f0;
  code *local_9e8;
  _Any_data local_9e0;
  code *local_9d0;
  code *local_9c8;
  _Any_data local_9c0;
  code *local_9b0;
  code *local_9a8;
  _Any_data local_9a0;
  code *local_990;
  code *local_988;
  _Any_data local_980;
  code *local_970;
  code *local_968;
  _Any_data local_960;
  code *local_950;
  code *local_948;
  _Any_data local_940;
  code *local_930;
  code *local_928;
  _Any_data local_920;
  code *local_910;
  code *local_908;
  _Any_data local_900;
  code *local_8f0;
  code *local_8e8;
  _Any_data local_8e0;
  code *local_8d0;
  code *local_8c8;
  _Any_data local_8c0;
  code *local_8b0;
  code *local_8a8;
  _Any_data local_8a0;
  code *local_890;
  code *local_888;
  _Any_data local_880;
  code *local_870;
  code *local_868;
  _Any_data local_860;
  code *local_850;
  code *local_848;
  _Any_data local_840;
  code *local_830;
  code *local_828;
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  _Any_data local_1c0;
  code *local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  undefined8 local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  undefined8 local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  undefined8 local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  size_type *local_148;
  string inputSourceMapFilename;
  string outputSourceMapUrl;
  string infile;
  string outfile;
  string outputSourceMapFilename;
  string local_88 [8];
  string WasmEmscriptenFinalizeOption;
  allocator<char> local_60;
  allocator<char> local_5f;
  allocator<char> local_5e;
  allocator<char> local_5d;
  allocator<char> local_5c;
  allocator<char> local_5b;
  allocator<char> local_5a;
  allocator<char> local_59;
  allocator<char> local_58;
  allocator<char> local_57;
  allocator<char> local_56;
  allocator<char> local_55;
  allocator<char> local_54;
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  undefined1 local_33;
  undefined1 local_32;
  char local_31;
  char local_30;
  char local_2f;
  char local_2e;
  char local_2d;
  undefined1 local_2c;
  bool sideModule;
  bool minimizeWasmChanges;
  bool legalizeJavaScriptFFI;
  bool bigInt;
  bool checkStackOverflow;
  bool noDynCalls;
  bool onlyI64DynCalls;
  bool debugInfo;
  bool DWARF;
  bool standaloneWasm;
  bool emitBinary;
  
  outputSourceMapUrl.field_2._8_8_ = &infile._M_string_length;
  infile._M_dataplus._M_p = (pointer)0x0;
  infile.field_2._8_8_ = &outfile._M_string_length;
  outfile._M_dataplus._M_p = (pointer)0x0;
  infile._M_string_length._0_1_ = 0;
  outfile._M_string_length._0_1_ = 0;
  local_148 = &inputSourceMapFilename._M_string_length;
  inputSourceMapFilename._M_dataplus._M_p = (pointer)0x0;
  outfile.field_2._8_8_ = &outputSourceMapFilename._M_string_length;
  outputSourceMapFilename._M_dataplus._M_p = (pointer)0x0;
  inputSourceMapFilename._M_string_length._0_1_ = 0;
  outputSourceMapFilename._M_string_length._0_1_ = 0;
  inputSourceMapFilename.field_2._8_8_ = &outputSourceMapUrl._M_string_length;
  outputSourceMapUrl._M_dataplus._M_p = (pointer)0x0;
  outputSourceMapUrl._M_string_length._0_1_ = 0;
  legalizeJavaScriptFFI = true;
  local_2c = 0;
  sideModule = false;
  local_33 = 0;
  local_31 = '\x01';
  local_30 = '\0';
  local_2f = '\0';
  minimizeWasmChanges = false;
  local_32 = 0;
  local_2e = '\0';
  local_2d = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"wasm-emscripten-finalize options",(allocator<char> *)&options.enabledFeatures
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,"wasm-emscripten-finalize",local_bb8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_ec8,"Performs Emscripten-specific transforms on .wasm files",
             (allocator<char> *)local_1c0._M_pod_data);
  wasm::ToolOptions::ToolOptions
            ((ToolOptions *)local_1438,(string *)&options.enabledFeatures,(string *)local_ec8);
  std::__cxx11::string::~string((string *)local_ec8);
  std::__cxx11::string::~string((string *)&options.enabledFeatures);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options.enabledFeatures,"--output",
             (allocator<char> *)(WasmEmscriptenFinalizeOption.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string<std::allocator<char>>((string *)local_ec8,"-o",&local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_bb8,"Output file",&local_5f);
  local_1c0._8_8_ = (undefined1 *)0x0;
  local_1c0._M_unused._0_8_ = (undefined8)((long)&infile.field_2 + 8);
  local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::
                 _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:69:10)>
                 ::_M_invoke;
  local_1b0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:69:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add((string *)&options,(string *)&options.enabledFeatures,
                              (string *)local_ec8,(string *)local_bb8,(Arguments)local_88,
                              (function *)0x1,SUB81(&local_1c0,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(outputSourceMapFilename.field_2._M_local_buf + 8),"--debuginfo",&local_5e);
  std::__cxx11::string::string<std::allocator<char>>(local_820,"-g",&local_5d);
  std::__cxx11::string::string<std::allocator<char>>
            (local_800,"Emit names section in wasm binary (or full debuginfo in wast)",&local_5c);
  local_a00._8_8_ = 0;
  local_a00._M_unused._M_object = &local_2c;
  local_9e8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:78:10)>
              ::_M_invoke;
  local_9f0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:78:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,(string *)(outputSourceMapFilename.field_2._M_local_buf + 8),
                              local_820,local_800,(Arguments)local_88,(function *)0x0,false);
  std::__cxx11::string::string<std::allocator<char>>(local_7e0,"--dwarf",&local_5b);
  std::__cxx11::string::string<std::allocator<char>>(local_7c0,"",&local_5a);
  std::__cxx11::string::string<std::allocator<char>>(local_7a0,"Update DWARF debug info",&local_59);
  local_9e0._8_8_ = 0;
  local_9e0._M_unused._M_object = &sideModule;
  local_9c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:84:10)>
              ::_M_invoke;
  local_9d0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:84:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,local_7e0,local_7c0,local_7a0,(Arguments)local_88,
                              (function *)0x0,SUB81(&local_9e0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_780,"--emit-text",&local_58);
  std::__cxx11::string::string<std::allocator<char>>(local_760,"-S",&local_57);
  std::__cxx11::string::string<std::allocator<char>>
            (local_740,
             "Emit text instead of binary for the output file. In this mode if no output file is specified, we write to stdout."
             ,&local_56);
  local_9c0._8_8_ = 0;
  local_9c0._M_unused._M_object = &legalizeJavaScriptFFI;
  local_9a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:91:10)>
              ::_M_invoke;
  local_9b0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:91:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,local_780,local_760,local_740,(Arguments)local_88,
                              (function *)0x0,SUB81(&local_9c0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_720,"--side-module",&local_55);
  std::__cxx11::string::string<std::allocator<char>>(local_700,"",&local_54);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6e0,"Input is an emscripten side module",&local_53);
  local_9a0._8_8_ = 0;
  local_9a0._M_unused._M_object = &local_33;
  local_988 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:97:10)>
              ::_M_invoke;
  local_990 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:97:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,local_720,local_700,local_6e0,(Arguments)local_88,
                              (function *)0x0,SUB81(&local_9a0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_6c0,"--input-source-map",&local_52);
  std::__cxx11::string::string<std::allocator<char>>(local_6a0,"-ism",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            (local_680,"Consume source map from the specified file",&local_50);
  local_980._8_8_ = 0;
  local_980._M_unused._M_object = &local_148;
  local_968 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:105:10)>
              ::_M_invoke;
  local_970 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:105:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,local_6c0,local_6a0,local_680,(Arguments)local_88,
                              (function *)0x1,SUB81(&local_980,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_660,"--no-legalize-javascript-ffi",&local_4f);
  std::__cxx11::string::string<std::allocator<char>>(local_640,"-nj",&local_4e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_620,
             "Do not fully legalize (i64->i32, f32->f64) the imports and exports for interfacing with JS"
             ,&local_4d);
  local_960._8_8_ = 0;
  local_960._M_unused._M_object = &local_31;
  local_948 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:114:10)>
              ::_M_invoke;
  local_950 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:114:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,local_660,local_640,local_620,(Arguments)local_88,
                              (function *)0x0,SUB81(&local_960,0));
  std::__cxx11::string::string<std::allocator<char>>(local_600,"--bigint",&local_4c);
  std::__cxx11::string::string<std::allocator<char>>(local_5e0,"-bi",&local_4b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5c0,
             "Assume JS will use wasm/JS BigInt integration, so wasm i64s will turn into JS BigInts, and there is no need for any legalization at all (not even minimal legalization of dynCalls)"
             ,&local_4a);
  local_940._8_8_ = 0;
  local_940._M_unused._M_object = &local_30;
  local_928 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:124:10)>
              ::_M_invoke;
  local_930 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:124:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,local_600,local_5e0,local_5c0,(Arguments)local_88,
                              (function *)0x0,SUB81(&local_940,0));
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"--output-source-map",&local_49);
  std::__cxx11::string::string<std::allocator<char>>(local_580,"-osm",&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            (local_560,"Emit source map to the specified file",&local_47);
  local_920._8_8_ = 0;
  local_920._M_unused._0_8_ = (undefined8)((long)&outfile.field_2 + 8);
  local_908 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:130:10)>
              ::_M_invoke;
  local_910 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:130:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,local_5a0,local_580,local_560,(Arguments)local_88,
                              (function *)0x1,SUB81(&local_920,0));
  std::__cxx11::string::string<std::allocator<char>>(local_540,"--output-source-map-url",&local_46);
  std::__cxx11::string::string<std::allocator<char>>(local_520,"-osu",&local_45);
  std::__cxx11::string::string<std::allocator<char>>
            (local_500,"Emit specified string as source map URL",&local_44);
  local_900._8_8_ = 0;
  local_900._M_unused._0_8_ = (undefined8)((long)&inputSourceMapFilename.field_2 + 8);
  local_8e8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:138:10)>
              ::_M_invoke;
  local_8f0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:138:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,local_540,local_520,local_500,(Arguments)local_88,
                              (function *)0x1,false);
  std::__cxx11::string::string<std::allocator<char>>(local_4e0,"--check-stack-overflow",&local_43);
  std::__cxx11::string::string<std::allocator<char>>(local_4c0,"",&local_42);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4a0,"Check for stack overflows every time the stack is extended",&local_41);
  local_8e0._8_8_ = 0;
  local_8e0._M_unused._M_object = &local_2f;
  local_8c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:146:10)>
              ::_M_invoke;
  local_8d0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:146:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,local_4e0,local_4c0,local_4a0,(Arguments)local_88,
                              (function *)0x0,SUB81(&local_8e0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_480,"--standalone-wasm",&local_40);
  std::__cxx11::string::string<std::allocator<char>>(local_460,"",&local_3f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_440,
             "Emit a wasm file that does not depend on JS, as much as possible, using wasi and other standard conventions etc. where possible"
             ,&local_3e);
  local_8c0._8_8_ = 0;
  local_8c0._M_unused._M_object = &minimizeWasmChanges;
  local_8a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:155:10)>
              ::_M_invoke;
  local_8b0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:155:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,local_480,local_460,local_440,(Arguments)local_88,
                              (function *)0x0,SUB81(&local_8c0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_420,"--minimize-wasm-changes",&local_3d);
  std::__cxx11::string::string<std::allocator<char>>(local_400,"",&local_3c);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3e0,
             "Modify the wasm as little as possible. This is useful during development as we reduce the number of changes to the wasm, as it lets emscripten control how much modifications to do."
             ,&local_3b);
  local_8a0._8_8_ = 0;
  local_8a0._M_unused._M_object = &local_32;
  local_888 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:165:10)>
              ::_M_invoke;
  local_890 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:165:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,local_420,local_400,local_3e0,(Arguments)local_88,
                              (function *)0x0,SUB81(&local_8a0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"--no-dyncalls",&local_3a);
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"",&local_39);
  std::__cxx11::string::string<std::allocator<char>>(local_380,"",&local_38);
  local_880._8_8_ = 0;
  local_880._M_unused._M_object = &local_2e;
  local_868 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:173:10)>
              ::_M_invoke;
  local_870 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:173:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,local_3c0,local_3a0,local_380,(Arguments)local_88,
                              (function *)0x0,SUB81(&local_880,0));
  std::__cxx11::string::string<std::allocator<char>>(local_360,"--dyncalls-i64",&local_37);
  std::__cxx11::string::string<std::allocator<char>>(local_340,"",&local_36);
  std::__cxx11::string::string<std::allocator<char>>(local_320,"",&local_35);
  local_860._8_8_ = 0;
  local_860._M_unused._M_object = &local_2d;
  local_848 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:179:10)>
              ::_M_invoke;
  local_850 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:179:10)>
              ::_M_manager;
  psVar5 = (string *)
           wasm::Options::add(psVar5,local_360,local_340,local_320,(Arguments)local_88,
                              (function *)0x0,SUB81(&local_860,0));
  std::__cxx11::string::string<std::allocator<char>>(local_300,"INFILE",&local_34);
  local_840._8_8_ = 0;
  local_840._M_unused._0_8_ = (undefined8)((long)&outputSourceMapUrl.field_2 + 8);
  local_828 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:184:21)>
              ::_M_invoke;
  local_830 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-emscripten-finalize.cpp:184:21)>
              ::_M_manager;
  wasm::Options::add_positional(psVar5,(Arguments)local_300,(function *)0x1);
  std::_Function_base::~_Function_base((_Function_base *)&local_840);
  std::__cxx11::string::~string(local_300);
  std::_Function_base::~_Function_base((_Function_base *)&local_860);
  std::__cxx11::string::~string(local_320);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string(local_360);
  std::_Function_base::~_Function_base((_Function_base *)&local_880);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::~string(local_3c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_8a0);
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::string::~string(local_400);
  std::__cxx11::string::~string(local_420);
  std::_Function_base::~_Function_base((_Function_base *)&local_8c0);
  std::__cxx11::string::~string(local_440);
  std::__cxx11::string::~string(local_460);
  std::__cxx11::string::~string(local_480);
  std::_Function_base::~_Function_base((_Function_base *)&local_8e0);
  std::__cxx11::string::~string(local_4a0);
  std::__cxx11::string::~string(local_4c0);
  std::__cxx11::string::~string(local_4e0);
  std::_Function_base::~_Function_base((_Function_base *)&local_900);
  std::__cxx11::string::~string(local_500);
  std::__cxx11::string::~string(local_520);
  std::__cxx11::string::~string(local_540);
  std::_Function_base::~_Function_base((_Function_base *)&local_920);
  std::__cxx11::string::~string(local_560);
  std::__cxx11::string::~string(local_580);
  std::__cxx11::string::~string(local_5a0);
  std::_Function_base::~_Function_base((_Function_base *)&local_940);
  std::__cxx11::string::~string(local_5c0);
  std::__cxx11::string::~string(local_5e0);
  std::__cxx11::string::~string(local_600);
  std::_Function_base::~_Function_base((_Function_base *)&local_960);
  std::__cxx11::string::~string(local_620);
  std::__cxx11::string::~string(local_640);
  std::__cxx11::string::~string(local_660);
  std::_Function_base::~_Function_base((_Function_base *)&local_980);
  std::__cxx11::string::~string(local_680);
  std::__cxx11::string::~string(local_6a0);
  std::__cxx11::string::~string(local_6c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_9a0);
  std::__cxx11::string::~string(local_6e0);
  std::__cxx11::string::~string(local_700);
  std::__cxx11::string::~string(local_720);
  std::_Function_base::~_Function_base((_Function_base *)&local_9c0);
  std::__cxx11::string::~string(local_740);
  std::__cxx11::string::~string(local_760);
  std::__cxx11::string::~string(local_780);
  std::_Function_base::~_Function_base((_Function_base *)&local_9e0);
  std::__cxx11::string::~string(local_7a0);
  std::__cxx11::string::~string(local_7c0);
  std::__cxx11::string::~string(local_7e0);
  std::_Function_base::~_Function_base((_Function_base *)&local_a00);
  std::__cxx11::string::~string(local_800);
  std::__cxx11::string::~string(local_820);
  std::__cxx11::string::~string((string *)(outputSourceMapFilename.field_2._M_local_buf + 8));
  std::_Function_base::~_Function_base((_Function_base *)&local_1c0);
  std::__cxx11::string::~string((string *)local_bb8);
  std::__cxx11::string::~string((string *)local_ec8);
  std::__cxx11::string::~string((string *)&options.enabledFeatures);
  wasm::Options::parse((int)&options,(char **)(ulong)(uint)argc);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&outputSourceMapUrl.field_2 + 8),"");
  bVar2 = legalizeJavaScriptFFI;
  if (!bVar3) {
    bVar3 = outfile._M_dataplus._M_p != (pointer)0x0;
    wasm::Module::Module((Module *)&options.enabledFeatures);
    bVar8 = bVar2 ^ 1;
    outputSourceMapFilename.field_2._12_4_ = 0;
    outputSourceMapFilename.field_2._M_local_buf[8] = bVar3 | bVar8 & 1;
    outputSourceMapFilename.field_2._M_local_buf[9] = sideModule & (bVar3 | bVar8);
    std::__cxx11::string::string(local_2e0,(string *)(outputSourceMapUrl.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_2c0,(string *)&local_148);
    wasm::ModuleReader::read
              ((undefined1 *)((long)&outputSourceMapFilename.field_2 + 8),local_2e0,
               &options.enabledFeatures);
    std::__cxx11::string::~string(local_2c0);
    std::__cxx11::string::~string(local_2e0);
    if (options.passOptions.passesToSkip._M_h._M_single_bucket._1_1_ == '\0') {
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear(local_10f0);
    }
    cVar4 = wasm::isDebugEnabled("emscripten-dump");
    if (cVar4 != '\0') {
      std::operator<<((ostream *)&std::cerr,"Module before:\n");
    }
    cVar4 = wasm::isDebugEnabled("emscripten-dump");
    if (cVar4 != '\0') {
      std::ostream::_M_insert<void_const*>(&std::cerr);
    }
    puVar1 = &options.field_0xb0;
    wasm::PassOptions::PassOptions(&local_14f0,(PassOptions *)puVar1);
    wasm::PassRunner::PassRunner
              ((PassRunner *)local_bb8,(Module *)&options.enabledFeatures,&local_14f0);
    wasm::PassOptions::~PassOptions(&local_14f0);
    if (local_2f == '\x01') {
      if (minimizeWasmChanges == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_ec8,"stack-check-handler",
                   (allocator<char> *)local_1c0._M_pod_data);
        pmVar6 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[](local_b40,(key_type *)local_ec8);
        std::__cxx11::string::assign((char *)pmVar6);
        std::__cxx11::string::~string((string *)local_ec8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                (local_2a0,"stack-check",(allocator<char> *)local_ec8);
      local_ac8._M_engaged = false;
      wasm::PassRunner::add(local_bb8,local_2a0);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_ac8);
      std::__cxx11::string::~string(local_2a0);
    }
    if ((local_2e == '\0') && (minimizeWasmChanges == false)) {
      if (local_2d == '\x01') {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_280,"generate-i64-dyncalls",(allocator<char> *)local_ec8);
        local_aa0._M_engaged = false;
        wasm::PassRunner::add(local_bb8,local_280);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset(&local_aa0);
        psVar5 = local_280;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_260,"generate-dyncalls",(allocator<char> *)local_ec8);
        local_a78._M_engaged = false;
        wasm::PassRunner::add(local_bb8,local_260);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset(&local_a78);
        psVar5 = local_260;
      }
      std::__cxx11::string::~string(psVar5);
    }
    if ((local_30 == '\0') && (local_31 == '\x01')) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_240,"legalize-js-interface",(allocator<char> *)local_ec8);
      local_a50._M_engaged = false;
      wasm::PassRunner::add(local_bb8,local_240);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_a50);
      std::__cxx11::string::~string(local_240);
    }
    if (sideModule == false) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_220,"strip-dwarf",(allocator<char> *)local_ec8);
      local_a28._M_engaged = false;
      wasm::PassRunner::add(local_bb8,local_220);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_a28);
      std::__cxx11::string::~string(local_220);
    }
    wasm::PassRunner::run();
    cVar4 = wasm::isDebugEnabled("emscripten-dump");
    if (cVar4 != '\0') {
      std::operator<<((ostream *)&std::cerr,"Module after:\n");
    }
    cVar4 = wasm::isDebugEnabled("emscripten-dump");
    if (cVar4 != '\0') {
      poVar7 = (ostream *)std::operator<<((ostream *)&std::cerr,(Module *)&options.enabledFeatures);
      std::operator<<(poVar7,'\n');
    }
    if (bVar3 || (bVar8 & 1) != 0) {
      wasm::Output::Output
                ((Output *)local_ec8,(string *)(infile.field_2._M_local_buf + 8),
                 legalizeJavaScriptFFI ^ Text);
      local_1a8 = &local_198;
      local_1a0 = 0;
      local_198._M_local_buf[0] = '\0';
      local_188 = &local_178;
      local_180 = 0;
      local_178._M_local_buf[0] = '\0';
      local_168 = &local_158;
      local_160 = 0;
      local_158._M_local_buf[0] = '\0';
      local_1c0._M_pod_data[0] = local_2c;
      local_1b0 = (code *)(CONCAT71((int7)((ulong)local_1b0 >> 8),legalizeJavaScriptFFI) &
                          0xffffffffffff00ff);
      local_1c0._8_8_ = puVar1;
      if (outputSourceMapFilename._M_dataplus._M_p != (pointer)0x0) {
        std::__cxx11::string::string(local_200,(string *)(outfile.field_2._M_local_buf + 8));
        std::__cxx11::string::_M_assign((string *)&local_188);
        std::__cxx11::string::~string(local_200);
        std::__cxx11::string::string
                  (local_1e0,(string *)(inputSourceMapFilename.field_2._M_local_buf + 8));
        std::__cxx11::string::_M_assign((string *)&local_168);
        std::__cxx11::string::~string(local_1e0);
      }
      wasm::ModuleWriter::write((Module *)&local_1c0,(Output *)&options.enabledFeatures);
      wasm::ModuleWriter::~ModuleWriter((ModuleWriter *)&local_1c0);
      wasm::Output::~Output((Output *)local_ec8);
    }
    wasm::PassRunner::~PassRunner((PassRunner *)local_bb8);
    wasm::Module::~Module((Module *)&options.enabledFeatures);
    wasm::ToolOptions::~ToolOptions((ToolOptions *)local_1438);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string((string *)(inputSourceMapFilename.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(outfile.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)(infile.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(outputSourceMapUrl.field_2._M_local_buf + 8));
    return 0;
  }
  wasm::Fatal::Fatal((Fatal *)&options.enabledFeatures);
  wasm::Fatal::operator<<
            ((Fatal *)&options.enabledFeatures,(char (*) [27])"Need to specify an infile\n");
  wasm::Fatal::~Fatal((Fatal *)&options.enabledFeatures);
}

Assistant:

int main(int argc, const char* argv[]) {
  std::string infile;
  std::string outfile;
  std::string inputSourceMapFilename;
  std::string outputSourceMapFilename;
  std::string outputSourceMapUrl;
  bool emitBinary = true;
  bool debugInfo = false;
  bool DWARF = false;
  bool sideModule = false;
  bool legalizeJavaScriptFFI = true;
  bool bigInt = false;
  bool checkStackOverflow = false;
  bool standaloneWasm = false;
  // TODO: remove after https://github.com/WebAssembly/binaryen/issues/3043
  bool minimizeWasmChanges = false;
  bool noDynCalls = false;
  bool onlyI64DynCalls = false;

  const std::string WasmEmscriptenFinalizeOption =
    "wasm-emscripten-finalize options";

  ToolOptions options("wasm-emscripten-finalize",
                      "Performs Emscripten-specific transforms on .wasm files");
  options
    .add("--output",
         "-o",
         "Output file",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::One,
         [&outfile](Options*, const std::string& argument) {
           outfile = argument;
           Colors::setEnabled(false);
         })
    .add("--debuginfo",
         "-g",
         "Emit names section in wasm binary (or full debuginfo in wast)",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&debugInfo](Options*, const std::string&) { debugInfo = true; })
    .add("--dwarf",
         "",
         "Update DWARF debug info",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&DWARF](Options*, const std::string&) { DWARF = true; })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file. "
         "In this mode if no output file is specified, we write to stdout.",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&emitBinary](Options*, const std::string&) { emitBinary = false; })
    .add("--side-module",
         "",
         "Input is an emscripten side module",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&sideModule](Options* o, const std::string& argument) {
           sideModule = true;
         })
    .add("--input-source-map",
         "-ism",
         "Consume source map from the specified file",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::One,
         [&inputSourceMapFilename](Options* o, const std::string& argument) {
           inputSourceMapFilename = argument;
         })
    .add("--no-legalize-javascript-ffi",
         "-nj",
         "Do not fully legalize (i64->i32, "
         "f32->f64) the imports and exports for interfacing with JS",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&legalizeJavaScriptFFI](Options* o, const std::string&) {
           legalizeJavaScriptFFI = false;
         })
    .add("--bigint",
         "-bi",
         "Assume JS will use wasm/JS BigInt integration, so wasm i64s will "
         "turn into JS BigInts, and there is no need for any legalization at "
         "all (not even minimal legalization of dynCalls)",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&bigInt](Options* o, const std::string&) { bigInt = true; })
    .add("--output-source-map",
         "-osm",
         "Emit source map to the specified file",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::One,
         [&outputSourceMapFilename](Options* o, const std::string& argument) {
           outputSourceMapFilename = argument;
         })
    .add("--output-source-map-url",
         "-osu",
         "Emit specified string as source map URL",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::One,
         [&outputSourceMapUrl](Options* o, const std::string& argument) {
           outputSourceMapUrl = argument;
         })
    .add("--check-stack-overflow",
         "",
         "Check for stack overflows every time the stack is extended",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&checkStackOverflow](Options* o, const std::string&) {
           checkStackOverflow = true;
         })
    .add("--standalone-wasm",
         "",
         "Emit a wasm file that does not depend on JS, as much as possible,"
         " using wasi and other standard conventions etc. where possible",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&standaloneWasm](Options* o, const std::string&) {
           standaloneWasm = true;
         })
    .add("--minimize-wasm-changes",
         "",
         "Modify the wasm as little as possible. This is useful during "
         "development as we reduce the number of changes to the wasm, as it "
         "lets emscripten control how much modifications to do.",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&minimizeWasmChanges](Options* o, const std::string&) {
           minimizeWasmChanges = true;
         })
    .add("--no-dyncalls",
         "",
         "",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&noDynCalls](Options* o, const std::string&) { noDynCalls = true; })
    .add("--dyncalls-i64",
         "",
         "",
         WasmEmscriptenFinalizeOption,
         Options::Arguments::Zero,
         [&onlyI64DynCalls](Options* o, const std::string&) {
           onlyI64DynCalls = true;
         })
    .add_positional("INFILE",
                    Options::Arguments::One,
                    [&infile](Options* o, const std::string& argument) {
                      infile = argument;
                    });
  options.parse(argc, argv);

  if (infile == "") {
    Fatal() << "Need to specify an infile\n";
  }

  // We will write the modified wasm if the user asked us to, either by
  // specifying an output file or requesting text output (which goes to stdout
  // by default).
  auto writeOutput = outfile.size() > 0 || !emitBinary;

  Module wasm;
  options.applyOptionsBeforeParse(wasm);
  ModuleReader reader;
  // If we are not writing output then we definitely don't need to read debug
  // info. However, if we emit output then definitely load the names section so
  // that we roundtrip names properly.
  reader.setDebugInfo(writeOutput);
  reader.setDWARF(DWARF && writeOutput);
  if (!writeOutput) {
    // If we are not writing the output then all we are doing is simple parsing
    // of metadata from global parts of the wasm such as imports and exports. In
    // that case, it is unnecessary to parse function contents which are the
    // great bulk of the work, and we can skip all that.
    // Note that the one case we do need function bodies for, pthreads + EM_ASM
    // parsing, requires special handling. The start function has code that we
    // parse in order to find the EM_ASMs, and for that reason the binary reader
    // will still parse the start function even in this mode.
    reader.setSkipFunctionBodies(true);
  }
  try {
    reader.read(infile, wasm, inputSourceMapFilename);
  } catch (ParseException& p) {
    p.dump(std::cerr);
    std::cerr << '\n';
    Fatal() << "error in parsing input";
  } catch (MapParseException& p) {
    p.dump(std::cerr);
    std::cerr << '\n';
    Fatal() << "error in parsing wasm source map";
  }

  options.applyOptionsAfterParse(wasm);

  BYN_TRACE_WITH_TYPE("emscripten-dump", "Module before:\n");
  BYN_DEBUG_WITH_TYPE("emscripten-dump", std::cerr << &wasm);

  EmscriptenGlueGenerator generator(wasm);
  generator.standalone = standaloneWasm;
  generator.sideModule = sideModule;
  generator.minimizeWasmChanges = minimizeWasmChanges;
  generator.onlyI64DynCalls = onlyI64DynCalls;
  generator.noDynCalls = noDynCalls;

  PassRunner passRunner(&wasm, options.passOptions);
  passRunner.setDebug(options.debug);
  passRunner.setDebugInfo(debugInfo);

  if (checkStackOverflow) {
    if (!standaloneWasm) {
      // In standalone mode we don't set a handler at all.. which means
      // just trap on overflow.
      passRunner.options.arguments["stack-check-handler"] =
        "__handle_stack_overflow";
    }
    passRunner.add("stack-check");
  }

  if (!noDynCalls && !standaloneWasm) {
    // If not standalone wasm then JS is relevant and we need dynCalls.
    if (onlyI64DynCalls) {
      passRunner.add("generate-i64-dyncalls");
    } else {
      passRunner.add("generate-dyncalls");
    }
  }

  // Legalize the wasm, if BigInts don't make that moot.
  if (!bigInt && legalizeJavaScriptFFI) {
    passRunner.add("legalize-js-interface");
  }

  // If DWARF is unused, strip it out. This avoids us keeping it alive
  // until wasm-opt strips it later.
  if (!DWARF) {
    passRunner.add("strip-dwarf");
  }

  passRunner.run();

  BYN_TRACE_WITH_TYPE("emscripten-dump", "Module after:\n");
  BYN_DEBUG_WITH_TYPE("emscripten-dump", std::cerr << wasm << '\n');

  if (writeOutput) {
    Output output(outfile, emitBinary ? Flags::Binary : Flags::Text);
    ModuleWriter writer(options.passOptions);
    writer.setDebugInfo(debugInfo);
    // writer.setSymbolMap(symbolMap);
    writer.setBinary(emitBinary);
    if (outputSourceMapFilename.size()) {
      writer.setSourceMapFilename(outputSourceMapFilename);
      writer.setSourceMapUrl(outputSourceMapUrl);
    }
    writer.write(wasm, output);
  }
  return 0;
}